

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O1

void __thiscall
gnuplotio::PlotData::PlotData<double[100][3],gnuplotio::Mode1D,gnuplotio::ModeText>
          (PlotData *this,long *arg,long *_plotspec,long *_arr_or_rec)

{
  ostringstream tmp;
  long *local_1d8;
  long *local_1d0;
  long local_1c8 [2];
  string *local_1b8;
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  (this->plotspec)._M_dataplus._M_p = (pointer)&(this->plotspec).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)this,*_plotspec,_plotspec[1] + *_plotspec);
  this->is_text = true;
  this->is_inline = true;
  this->has_data = true;
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  (this->data)._M_string_length = 0;
  (this->data).field_2._M_local_buf[0] = '\0';
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  (this->arr_or_rec)._M_dataplus._M_p = (pointer)&(this->arr_or_rec).field_2;
  local_1b0 = &this->data;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->arr_or_rec,*_arr_or_rec,_arr_or_rec[1] + *_arr_or_rec);
  (this->bin_fmt)._M_dataplus._M_p = (pointer)&(this->bin_fmt).field_2;
  (this->bin_fmt)._M_string_length = 0;
  (this->bin_fmt).field_2._M_local_buf[0] = '\0';
  (this->bin_size)._M_dataplus._M_p = (pointer)&(this->bin_size).field_2;
  (this->bin_size)._M_string_length = 0;
  (this->bin_size).field_2._M_local_buf[0] = '\0';
  local_1b8 = &this->arr_or_rec;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1d8 = arg;
  local_1d0 = arg + 300;
  print_block<1ul,gnuplotio::IteratorRange<double_const(*)[3],double[3]>,gnuplotio::ModeText>
            (local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->data,(string *)&local_1d8);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  if (this->is_text == false) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    local_1d8 = arg;
    local_1d0 = arg + 300;
    print_block<1ul,gnuplotio::IteratorRange<double_const(*)[3],double[3]>,gnuplotio::ModeBinfmt>
              (local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->bin_fmt,(string *)&local_1d8);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->bin_size,(string *)&local_1d8);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

PlotData(
        const T &arg,
        const std::string &_plotspec,
        const std::string &_arr_or_rec,
        OrganizationMode, PrintMode
    ) :
        plotspec(_plotspec),
        is_text(PrintMode::is_text),
        is_inline(true),
        has_data(true),
        arr_or_rec(_arr_or_rec)
    {
        {
            std::ostringstream tmp;
            top_level_array_sender(tmp, arg, OrganizationMode(), PrintMode());
            data = tmp.str();
        }

        if(!is_text) {
            try {
                {
                    std::ostringstream tmp;
                    top_level_array_sender(tmp, arg, OrganizationMode(), ModeBinfmt());
                    bin_fmt = tmp.str();
                }
                {
                    std::ostringstream tmp;
                    top_level_array_sender(tmp, arg, OrganizationMode(), ModeSize());
                    bin_size = tmp.str();
                }
            } catch(const plotting_empty_container &) {
                bin_fmt = "";
                bin_size = "0";
            }
        }
    }